

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode state_ratelimiting(Curl_easy *data,curltime *nowp,CURLcode *resultp)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  int iVar9;
  curltime now;
  curltime now_00;
  curltime now_01;
  curltime now_02;
  long local_38;
  timediff_t send_timeout_ms;
  timediff_t recv_timeout_ms;
  CURLMcode rc;
  CURLcode result;
  CURLcode *resultp_local;
  curltime *nowp_local;
  Curl_easy *data_local;
  
  recv_timeout_ms._0_4_ = CURLM_OK;
  iVar9 = Curl_pgrsUpdate(data);
  if (iVar9 == 0) {
    uVar1 = nowp->tv_sec;
    uVar2 = nowp->tv_usec;
    now_01.tv_usec = uVar2;
    now_01.tv_sec = uVar1;
    now_01._12_4_ = 0;
    recv_timeout_ms._4_4_ = Curl_speedcheck(data,now_01);
  }
  else {
    recv_timeout_ms._4_4_ = CURLE_ABORTED_BY_CALLBACK;
  }
  if (recv_timeout_ms._4_4_ == CURLE_OK) {
    send_timeout_ms = 0;
    local_38 = 0;
    if ((data->set).max_send_speed != 0) {
      uVar3 = nowp->tv_sec;
      uVar4 = nowp->tv_usec;
      now.tv_usec = uVar4;
      now.tv_sec = uVar3;
      now._12_4_ = 0;
      local_38 = Curl_pgrsLimitWaitTime(&(data->progress).ul,(data->set).max_send_speed,now);
    }
    if ((data->set).max_recv_speed != 0) {
      uVar5 = nowp->tv_sec;
      uVar6 = nowp->tv_usec;
      now_00.tv_usec = uVar6;
      now_00.tv_sec = uVar5;
      now_00._12_4_ = 0;
      send_timeout_ms =
           Curl_pgrsLimitWaitTime(&(data->progress).dl,(data->set).max_recv_speed,now_00);
    }
    if ((local_38 == 0) && (send_timeout_ms == 0)) {
      mstate(data,MSTATE_PERFORMING);
      uVar7 = nowp->tv_sec;
      uVar8 = nowp->tv_usec;
      now_02.tv_usec = uVar8;
      now_02.tv_sec = uVar7;
      now_02._12_4_ = 0;
      Curl_ratelimit(data,now_02);
      recv_timeout_ms._0_4_ = CURLM_CALL_MULTI_PERFORM;
    }
    else if (local_38 < send_timeout_ms) {
      Curl_expire(data,send_timeout_ms,EXPIRE_TOOFAST);
    }
    else {
      Curl_expire(data,local_38,EXPIRE_TOOFAST);
    }
  }
  else {
    if (((data->conn->handler->flags & 2) == 0) && (recv_timeout_ms._4_4_ != CURLE_HTTP2_STREAM)) {
      Curl_conncontrol(data->conn,2);
    }
    multi_posttransfer(data);
    multi_done(data,recv_timeout_ms._4_4_,true);
  }
  *resultp = recv_timeout_ms._4_4_;
  return (CURLMcode)recv_timeout_ms;
}

Assistant:

static CURLMcode state_ratelimiting(struct Curl_easy *data,
                                    struct curltime *nowp,
                                    CURLcode *resultp)
{
  CURLcode result = CURLE_OK;
  CURLMcode rc = CURLM_OK;
  DEBUGASSERT(data->conn);
  /* if both rates are within spec, resume transfer */
  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, *nowp);

  if(result) {
    if(!(data->conn->handler->flags & PROTOPT_DUAL) &&
       result != CURLE_HTTP2_STREAM)
      streamclose(data->conn, "Transfer returned error");

    multi_posttransfer(data);
    multi_done(data, result, TRUE);
  }
  else {
    timediff_t recv_timeout_ms = 0;
    timediff_t send_timeout_ms = 0;
    if(data->set.max_send_speed)
      send_timeout_ms =
        Curl_pgrsLimitWaitTime(&data->progress.ul,
                               data->set.max_send_speed,
                               *nowp);

    if(data->set.max_recv_speed)
      recv_timeout_ms =
        Curl_pgrsLimitWaitTime(&data->progress.dl,
                               data->set.max_recv_speed,
                               *nowp);

    if(!send_timeout_ms && !recv_timeout_ms) {
      multistate(data, MSTATE_PERFORMING);
      Curl_ratelimit(data, *nowp);
      /* start performing again right away */
      rc = CURLM_CALL_MULTI_PERFORM;
    }
    else if(send_timeout_ms >= recv_timeout_ms)
      Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
    else
      Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
  }
  *resultp = result;
  return rc;
}